

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow **ppIVar3;
  long in_RDI;
  ImRect r_avoid_2;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid_1;
  ImVec2 *in_stack_00000058;
  ImRect r_avoid;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImRect r_outer;
  ImGuiContext *g;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  ImRect *in_stack_ffffffffffffff60;
  ImGuiWindow *in_stack_ffffffffffffff70;
  ImVec2 local_8;
  
  pIVar2 = GImGui;
  GetWindowAllowedExtentRect(in_stack_ffffffffffffff70);
  if ((*(uint *)(in_RDI + 0xc) & 0x10000000) == 0) {
    if ((*(uint *)(in_RDI + 0xc) & 0x4000000) == 0) {
      if ((*(uint *)(in_RDI + 0xc) & 0x2000000) == 0) {
        local_8 = *(ImVec2 *)(in_RDI + 0x10);
      }
      else {
        NavCalcPreferredRefPos();
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        if ((((pIVar2->NavDisableHighlight & 1U) == 0) && ((pIVar2->NavDisableMouseHover & 1U) != 0)
            ) && (((pIVar2->IO).ConfigFlags & 4U) == 0)) {
          ImRect::ImRect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                         in_stack_ffffffffffffff50);
        }
        else {
          ImRect::ImRect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                         in_stack_ffffffffffffff50);
        }
        local_8 = FindBestWindowPosForPopupEx
                            (in_stack_00000058,stack0x00000050,(ImGuiDir *)r_avoid_1._4_8_,_sc,
                             (ImRect *)ref_pos,(ImGuiPopupPositionPolicy)r_avoid_2.Max.y);
      }
    }
    else {
      ImRect::ImRect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      local_8 = FindBestWindowPosForPopupEx
                          (in_stack_00000058,stack0x00000050,(ImGuiDir *)r_avoid_1._4_8_,_sc,
                           (ImRect *)ref_pos,(ImGuiPopupPositionPolicy)r_avoid_2.Max.y);
    }
  }
  else {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[]
                        (&pIVar2->CurrentWindowStack,(pIVar2->CurrentWindowStack).Size + -2);
    pIVar1 = *ppIVar3;
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (((pIVar1->DC).MenuBarAppending & 1U) == 0) {
      ImRect::ImRect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    }
    else {
      ImRect::ImRect(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    }
    local_8 = FindBestWindowPosForPopupEx
                        (in_stack_00000058,stack0x00000050,(ImGuiDir *)r_avoid_1._4_8_,_sc,
                         (ImRect *)ref_pos,(ImGuiPopupPositionPolicy)r_avoid_2.Max.y);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}